

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O3

void __thiscall
QTriangulator<unsigned_int>::SimpleToMonotone::monotoneDecomposition(SimpleToMonotone *this)

{
  Edge *pEVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  long lVar5;
  Node *pNVar6;
  Node *parent;
  Edge *pEVar7;
  QPodPoint *pQVar8;
  Node *node;
  uint *puVar9;
  char *pcVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long in_FS_OFFSET;
  char local_78 [24];
  char *local_60;
  QDataBuffer<std::pair<int,_int>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_edges).siz != 0) {
    local_58.buffer = (pair<int,_int> *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.capacity = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.siz = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QDataBuffer<std::pair<int,_int>_>::QDataBuffer(&local_58,(this->m_upperVertex).siz);
    lVar13 = (this->m_edges).siz;
    if (lVar13 < 2) {
      pEVar7 = (this->m_edges).buffer;
      pQVar8 = (this->m_parent->m_vertices).buffer;
      lVar11 = 0;
    }
    else {
      pEVar7 = (this->m_edges).buffer;
      pQVar8 = (this->m_parent->m_vertices).buffer;
      puVar9 = &pEVar7[1].from;
      iVar12 = 0;
      lVar11 = 1;
      do {
        bVar4 = pQVar8[*puVar9].y < pQVar8[pEVar7[iVar12].from].y;
        if (pQVar8[*puVar9].y == pQVar8[pEVar7[iVar12].from].y) {
          bVar4 = pQVar8[*puVar9].x < pQVar8[pEVar7[iVar12].from].x;
        }
        iVar2 = (int)lVar11;
        if (!bVar4) {
          iVar2 = iVar12;
        }
        iVar12 = iVar2;
        lVar11 = lVar11 + 1;
        puVar9 = puVar9 + 10;
      } while (lVar13 != lVar11);
      lVar11 = (long)iVar12;
    }
    this->m_clockwiseOrder =
         ((long)pQVar8[pEVar7[lVar11].from].y - (long)pQVar8[pEVar7[pEVar7[lVar11].previous].from].y
         ) * ((long)pQVar8[pEVar7[lVar11].to].x -
             (long)pQVar8[pEVar7[pEVar7[lVar11].previous].from].x) <
         ((long)pQVar8[pEVar7[lVar11].from].x - (long)pQVar8[pEVar7[pEVar7[lVar11].previous].from].x
         ) * ((long)pQVar8[pEVar7[lVar11].to].y -
             (long)pQVar8[pEVar7[pEVar7[lVar11].previous].from].y);
    if (0 < lVar13) {
      lVar13 = 0;
      do {
        classifyVertex(this,(int)lVar13);
        lVar13 = lVar13 + 1;
      } while (lVar13 < (this->m_edges).siz);
    }
    fillPriorityQueue(this);
    lVar13 = (this->m_upperVertex).siz;
    if (lVar13 != 0) {
      do {
        pEVar7 = (this->m_edges).buffer;
        iVar12 = (this->m_upperVertex).buffer[lVar13 + -1];
        (this->m_upperVertex).siz = lVar13 + -1;
        lVar13 = (long)iVar12;
        if (SplitVertex < pEVar7[lVar13].type) goto LAB_00443fff;
        pEVar1 = pEVar7 + lVar13;
        iVar2 = pEVar1->previous;
        lVar11 = (long)iVar2;
        switch(pEVar7[lVar13].type) {
        case MergeVertex:
          pNVar6 = searchEdgeLeftOfPoint(this,pEVar1->from);
          if (pNVar6 == (Node *)0x0) {
            local_78[0] = '\x02';
            local_78[1] = '\0';
            local_78[2] = '\0';
            local_78[3] = '\0';
            local_78[4] = '\0';
            local_78[5] = '\0';
            local_78[6] = '\0';
            local_78[7] = '\0';
            local_78[8] = '\0';
            local_78[9] = '\0';
            local_78[10] = '\0';
            local_78[0xb] = '\0';
            local_78[0xc] = '\0';
            local_78[0xd] = '\0';
            local_78[0xe] = '\0';
            local_78[0xf] = '\0';
            local_78[0x10] = '\0';
            local_78[0x11] = '\0';
            local_78[0x12] = '\0';
            local_78[0x13] = '\0';
            local_78[0x14] = '\0';
            local_78[0x15] = '\0';
            local_78[0x16] = '\0';
            local_78[0x17] = '\0';
            local_60 = "default";
            QMessageLogger::warning(local_78,"Inconsistent polygon. (#4)");
          }
          else {
            lVar5 = (long)pNVar6->data;
            pEVar7 = (this->m_edges).buffer;
            iVar2 = pEVar7[lVar5].helper;
            if (pEVar7[iVar2].type == MergeVertex) {
              QDataBuffer<std::pair<int,_int>_>::reserve(&local_58,(qsizetype)(local_58.siz + 1));
              local_58.buffer[local_58.siz].first = iVar12;
              local_58.buffer[local_58.siz].second = iVar2;
              local_58.siz = local_58.siz + 1;
              lVar5 = (long)pNVar6->data;
              pEVar7 = (this->m_edges).buffer;
            }
            pEVar7[lVar5].helper = iVar12;
          }
          break;
        case RegularVertex:
          if (pEVar1->pointingUp != this->m_clockwiseOrder) {
            pNVar6 = searchEdgeLeftOfPoint(this,pEVar1->from);
            if (pNVar6 != (Node *)0x0) {
              lVar13 = (long)pNVar6->data;
              pEVar7 = (this->m_edges).buffer;
              iVar2 = pEVar7[lVar13].helper;
              if (pEVar7[iVar2].type == MergeVertex) {
                QDataBuffer<std::pair<int,_int>_>::reserve(&local_58,(qsizetype)(local_58.siz + 1));
                local_58.buffer[local_58.siz].first = iVar12;
                local_58.buffer[local_58.siz].second = iVar2;
                local_58.siz = local_58.siz + 1;
                lVar13 = (long)pNVar6->data;
                pEVar7 = (this->m_edges).buffer;
              }
              pEVar7[lVar13].helper = iVar12;
              goto LAB_00443fff;
            }
            pcVar10 = "Inconsistent polygon. (#2)";
            goto LAB_004441a8;
          }
          pNVar6 = pEVar1->node;
          if (pNVar6 == (Node *)0x0) {
            pNVar6 = pEVar7[lVar11].node;
            if (pNVar6 == (Node *)0x0) {
              pcVar10 = "Inconsistent polygon. (#1)";
              goto LAB_004441a8;
            }
            iVar2 = pEVar7[lVar11].helper;
            if (pEVar7[iVar2].type == MergeVertex) {
              QDataBuffer<std::pair<int,_int>_>::reserve(&local_58,(qsizetype)(local_58.siz + 1));
              local_58.buffer[local_58.siz].first = iVar12;
              local_58.buffer[local_58.siz].second = iVar2;
              local_58.siz = local_58.siz + 1;
              pEVar7 = (this->m_edges).buffer;
              pNVar6 = pEVar7[lVar11].node;
            }
            pEVar7[lVar13].node = pNVar6;
            pEVar7[lVar11].node = (Node *)0x0;
            (pEVar7[lVar13].node)->data = iVar12;
            pEVar7[lVar13].helper = iVar12;
          }
          else {
            iVar3 = pEVar1->helper;
            if (pEVar7[iVar3].type == MergeVertex) {
              QDataBuffer<std::pair<int,_int>_>::reserve(&local_58,(qsizetype)(local_58.siz + 1));
              local_58.buffer[local_58.siz].first = iVar12;
              local_58.buffer[local_58.siz].second = iVar3;
              local_58.siz = local_58.siz + 1;
              pEVar7 = (this->m_edges).buffer;
              pNVar6 = pEVar7[lVar13].node;
            }
            pEVar7[lVar11].node = pNVar6;
            pEVar7[lVar13].node = (Node *)0x0;
            (pEVar7[lVar11].node)->data = iVar2;
            pEVar7[lVar11].helper = iVar12;
          }
          goto LAB_00443fff;
        case StartVertex:
          goto switchD_00443c3c_caseD_3;
        case SplitVertex:
          pNVar6 = searchEdgeLeftOfPoint(this,pEVar1->from);
          if (pNVar6 == (Node *)0x0) {
            local_78[0] = '\x02';
            local_78[1] = '\0';
            local_78[2] = '\0';
            local_78[3] = '\0';
            local_78[4] = '\0';
            local_78[5] = '\0';
            local_78[6] = '\0';
            local_78[7] = '\0';
            local_78[8] = '\0';
            local_78[9] = '\0';
            local_78[10] = '\0';
            local_78[0xb] = '\0';
            local_78[0xc] = '\0';
            local_78[0xd] = '\0';
            local_78[0xe] = '\0';
            local_78[0xf] = '\0';
            local_78[0x10] = '\0';
            local_78[0x11] = '\0';
            local_78[0x12] = '\0';
            local_78[0x13] = '\0';
            local_78[0x14] = '\0';
            local_78[0x15] = '\0';
            local_78[0x16] = '\0';
            local_78[0x17] = '\0';
            local_60 = "default";
            QMessageLogger::warning(local_78,"Inconsistent polygon. (#3)");
          }
          else {
            iVar3 = (this->m_edges).buffer[pNVar6->data].helper;
            QDataBuffer<std::pair<int,_int>_>::reserve(&local_58,(qsizetype)(local_58.siz + 1));
            local_58.buffer[local_58.siz].first = iVar12;
            local_58.buffer[local_58.siz].second = iVar3;
            local_58.siz = local_58.siz + 1;
            (this->m_edges).buffer[pNVar6->data].helper = iVar12;
          }
          goto switchD_00443c3c_caseD_3;
        }
        if (this->m_clockwiseOrder == true) {
          pEVar7 = (this->m_edges).buffer;
          iVar2 = pEVar7[lVar13].helper;
          if (pEVar7[iVar2].type == MergeVertex) {
            QDataBuffer<std::pair<int,_int>_>::reserve(&local_58,(qsizetype)(local_58.siz + 1));
            local_58.buffer[local_58.siz].first = iVar12;
            local_58.buffer[local_58.siz].second = iVar2;
            local_58.siz = local_58.siz + 1;
            pEVar7 = (this->m_edges).buffer;
          }
          pNVar6 = pEVar7[lVar13].node;
          lVar11 = lVar13;
          if (pNVar6 != (Node *)0x0) goto LAB_00443ef3;
          pcVar10 = "Inconsistent polygon. (#5)";
LAB_004441a8:
          local_60 = "default";
          local_78[0x14] = '\0';
          local_78[0x15] = '\0';
          local_78[0x16] = '\0';
          local_78[0x17] = '\0';
          local_78[0xc] = '\0';
          local_78[0xd] = '\0';
          local_78[0xe] = '\0';
          local_78[0xf] = '\0';
          local_78[0x10] = '\0';
          local_78[0x11] = '\0';
          local_78[0x12] = '\0';
          local_78[0x13] = '\0';
          local_78[4] = '\0';
          local_78[5] = '\0';
          local_78[6] = '\0';
          local_78[7] = '\0';
          local_78[8] = '\0';
          local_78[9] = '\0';
          local_78[10] = '\0';
          local_78[0xb] = '\0';
          local_78[0] = '\x02';
          local_78[1] = '\0';
          local_78[2] = '\0';
          local_78[3] = '\0';
          QMessageLogger::warning(local_78,pcVar10);
        }
        else {
          pEVar7 = (this->m_edges).buffer;
          iVar2 = pEVar7[lVar11].helper;
          if (pEVar7[iVar2].type == MergeVertex) {
            QDataBuffer<std::pair<int,_int>_>::reserve(&local_58,(qsizetype)(local_58.siz + 1));
            local_58.buffer[local_58.siz].first = iVar12;
            local_58.buffer[local_58.siz].second = iVar2;
            local_58.siz = local_58.siz + 1;
            pEVar7 = (this->m_edges).buffer;
          }
          pNVar6 = pEVar7[lVar11].node;
          if (pNVar6 == (Node *)0x0) {
            pcVar10 = "Inconsistent polygon. (#6)";
            goto LAB_004441a8;
          }
LAB_00443ef3:
          pEVar7 = pEVar7 + lVar11;
          QRBTree<int>::detach(&this->m_edgeList,pNVar6);
          pEVar7->node->right = (this->m_edgeList).freeList;
          (this->m_edgeList).freeList = pEVar7->node;
          pEVar7->node = (Node *)0x0;
        }
LAB_00443fff:
        lVar13 = (this->m_upperVertex).siz;
      } while (lVar13 != 0);
    }
    if (0 < local_58.siz) {
      lVar13 = 0;
      do {
        createDiagonal(this,local_58.buffer[lVar13].first,local_58.buffer[lVar13].second);
        lVar13 = lVar13 + 1;
      } while (lVar13 < local_58.siz);
    }
    if (local_58.buffer != (pair<int,_int> *)0x0) {
      QtPrivate::sizedFree(local_58.buffer,local_58.capacity << 3);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
switchD_00443c3c_caseD_3:
  if (this->m_clockwiseOrder == true) {
    parent = searchEdgeLeftOfEdge(this,iVar2);
    pNVar6 = (this->m_edgeList).freeList;
    if (pNVar6 == (Node *)0x0) {
      pNVar6 = (Node *)operator_new(0x28);
    }
    else {
      (this->m_edgeList).freeList = pNVar6->right;
    }
    pNVar6->parent = (Node *)0x0;
    pNVar6->left = (Node *)0x0;
    pNVar6->right = (Node *)0x0;
    pNVar6->red = true;
    pNVar6->data = iVar2;
    pEVar7 = (this->m_edges).buffer;
    pEVar7[lVar11].node = pNVar6;
    pEVar7[lVar11].helper = iVar12;
  }
  else {
    parent = searchEdgeLeftOfEdge(this,iVar12);
    pNVar6 = (this->m_edgeList).freeList;
    if (pNVar6 == (Node *)0x0) {
      pNVar6 = (Node *)operator_new(0x28);
    }
    else {
      (this->m_edgeList).freeList = pNVar6->right;
    }
    pNVar6->parent = (Node *)0x0;
    pNVar6->left = (Node *)0x0;
    pNVar6->right = (Node *)0x0;
    pNVar6->red = true;
    pNVar6->data = iVar12;
    pEVar7 = (this->m_edges).buffer;
    pEVar7[lVar13].node = pNVar6;
    pEVar7[lVar13].helper = iVar12;
  }
  QRBTree<int>::attachAfter(&this->m_edgeList,parent,pNVar6);
  goto LAB_00443fff;
}

Assistant:

void QTriangulator<T>::SimpleToMonotone::monotoneDecomposition()
{
    if (m_edges.isEmpty())
        return;

    Q_ASSERT(!m_edgeList.root);
    QDataBuffer<std::pair<int, int> > diagonals(m_upperVertex.size());

    int i = 0;
    for (int index = 1; index < m_edges.size(); ++index) {
        if (m_parent->m_vertices.at(m_edges.at(index).from) < m_parent->m_vertices.at(m_edges.at(i).from))
            i = index;
    }
    Q_ASSERT(i < m_edges.size());
    int j = m_edges.at(i).previous;
    Q_ASSERT(j < m_edges.size());
    m_clockwiseOrder = qPointIsLeftOfLine(m_parent->m_vertices.at((quint32)m_edges.at(i).from),
        m_parent->m_vertices.at((quint32)m_edges.at(j).from), m_parent->m_vertices.at((quint32)m_edges.at(i).to));

    classifyVertices();
    fillPriorityQueue();

    // debug: set helpers explicitly (shouldn't be necessary)
    //for (int i = 0; i < m_edges.size(); ++i)
    //    m_edges.at(i).helper = m_edges.at(i).upper();

    while (!m_upperVertex.isEmpty()) {
        i = m_upperVertex.last();
        Q_ASSERT(i < m_edges.size());
        m_upperVertex.pop_back();
        j = m_edges.at(i).previous;
        Q_ASSERT(j < m_edges.size());

        QRBTree<int>::Node *leftEdgeNode = nullptr;

        switch (m_edges.at(i).type) {
        case RegularVertex:
            // If polygon interior is to the right of the vertex...
            if (m_edges.at(i).pointingUp == m_clockwiseOrder) {
                if (m_edges.at(i).node) {
                    Q_ASSERT(!m_edges.at(j).node);
                    if (m_edges.at(m_edges.at(i).helper).type == MergeVertex)
                        diagonals.add(std::pair<int, int>(i, m_edges.at(i).helper));
                    m_edges.at(j).node = m_edges.at(i).node;
                    m_edges.at(i).node = nullptr;
                    m_edges.at(j).node->data = j;
                    m_edges.at(j).helper = i;
                } else if (m_edges.at(j).node) {
                    Q_ASSERT(!m_edges.at(i).node);
                    if (m_edges.at(m_edges.at(j).helper).type == MergeVertex)
                        diagonals.add(std::pair<int, int>(i, m_edges.at(j).helper));
                    m_edges.at(i).node = m_edges.at(j).node;
                    m_edges.at(j).node = nullptr;
                    m_edges.at(i).node->data = i;
                    m_edges.at(i).helper = i;
                } else {
                    qWarning("Inconsistent polygon. (#1)");
                }
            } else {
                leftEdgeNode = searchEdgeLeftOfPoint(m_edges.at(i).from);
                if (leftEdgeNode) {
                    if (m_edges.at(m_edges.at(leftEdgeNode->data).helper).type == MergeVertex)
                        diagonals.add(std::pair<int, int>(i, m_edges.at(leftEdgeNode->data).helper));
                    m_edges.at(leftEdgeNode->data).helper = i;
                } else {
                    qWarning("Inconsistent polygon. (#2)");
                }
            }
            break;
        case SplitVertex:
            leftEdgeNode = searchEdgeLeftOfPoint(m_edges.at(i).from);
            if (leftEdgeNode) {
                diagonals.add(std::pair<int, int>(i, m_edges.at(leftEdgeNode->data).helper));
                m_edges.at(leftEdgeNode->data).helper = i;
            } else {
                qWarning("Inconsistent polygon. (#3)");
            }
            Q_FALLTHROUGH();
        case StartVertex:
            if (m_clockwiseOrder) {
                leftEdgeNode = searchEdgeLeftOfEdge(j);
                QRBTree<int>::Node *node = m_edgeList.newNode();
                node->data = j;
                m_edges.at(j).node = node;
                m_edges.at(j).helper = i;
                m_edgeList.attachAfter(leftEdgeNode, node);
                Q_ASSERT(m_edgeList.validate());
            } else  {
                leftEdgeNode = searchEdgeLeftOfEdge(i);
                QRBTree<int>::Node *node = m_edgeList.newNode();
                node->data = i;
                m_edges.at(i).node = node;
                m_edges.at(i).helper = i;
                m_edgeList.attachAfter(leftEdgeNode, node);
                Q_ASSERT(m_edgeList.validate());
            }
            break;
        case MergeVertex:
            leftEdgeNode = searchEdgeLeftOfPoint(m_edges.at(i).from);
            if (leftEdgeNode) {
                if (m_edges.at(m_edges.at(leftEdgeNode->data).helper).type == MergeVertex)
                    diagonals.add(std::pair<int, int>(i, m_edges.at(leftEdgeNode->data).helper));
                m_edges.at(leftEdgeNode->data).helper = i;
            } else {
                qWarning("Inconsistent polygon. (#4)");
            }
            Q_FALLTHROUGH();
        case EndVertex:
            if (m_clockwiseOrder) {
                if (m_edges.at(m_edges.at(i).helper).type == MergeVertex)
                    diagonals.add(std::pair<int, int>(i, m_edges.at(i).helper));
                if (m_edges.at(i).node) {
                    m_edgeList.deleteNode(m_edges.at(i).node);
                    Q_ASSERT(m_edgeList.validate());
                } else {
                    qWarning("Inconsistent polygon. (#5)");
                }
            } else {
                if (m_edges.at(m_edges.at(j).helper).type == MergeVertex)
                    diagonals.add(std::pair<int, int>(i, m_edges.at(j).helper));
                if (m_edges.at(j).node) {
                    m_edgeList.deleteNode(m_edges.at(j).node);
                    Q_ASSERT(m_edgeList.validate());
                } else {
                    qWarning("Inconsistent polygon. (#6)");
                }
            }
            break;
        }
    }

    for (int i = 0; i < diagonals.size(); ++i)
        createDiagonal(diagonals.at(i).first, diagonals.at(i).second);
}